

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::rfind(StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  unsigned_long *puVar2;
  char *__first2;
  char *pcVar3;
  char *__last1;
  long in_RDX;
  long *in_RDI;
  char *result;
  char *last;
  size_t ulen;
  unsigned_long local_60;
  char *in_stack_ffffffffffffffb8;
  unsigned_long local_28 [3];
  long local_10;
  unsigned_long local_8;
  
  if (in_RDI[1] < in_RDX) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    pcVar3 = (char *)in_RDI[1];
    if (in_RDX == 0) {
      puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffd0,local_28);
      local_8 = *puVar2;
    }
    else {
      lVar1 = *in_RDI;
      __first2 = pcVar3 + -in_RDX;
      local_10 = in_RDX;
      puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffc0,local_28);
      __last1 = (char *)(lVar1 + *puVar2 + local_10);
      pcVar3 = std::find_end<char_const*,char_const*>
                         (pcVar3,__last1,__first2,in_stack_ffffffffffffffb8);
      if (pcVar3 == __last1) {
        local_60 = 0xffffffffffffffff;
      }
      else {
        local_60 = (long)pcVar3 - *in_RDI;
      }
      local_8 = local_60;
    }
  }
  return local_8;
}

Assistant:

stringpiece_ssize_type StringPiece::rfind(StringPiece s, size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_t ulen = length_;
  if (s.length_ == 0) return std::min(ulen, pos);

  const char* last = ptr_ + std::min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}